

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::String::FormatByte_abi_cxx11_
          (string *__return_storage_ptr__,String *this,uchar value)

{
  long lVar1;
  stringstream local_1a8 [8];
  stringstream ss;
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  lVar1 = *(long *)(ss._8_8_ + -0x18);
  if ((&ss.field_0xe9)[lVar1] == '\0') {
    std::ios::widen((char)&ss + '\b' + (char)lVar1);
    (&ss.field_0xe9)[lVar1] = 1;
  }
  (&ss.field_0xe8)[lVar1] = 0x30;
  *(undefined8 *)(&ss._M_stringbuf + *(long *)(ss._8_8_ + -0x18)) = 2;
  *(uint *)(&ss.field_0x20 + *(long *)(ss._8_8_ + -0x18)) =
       *(uint *)(&ss.field_0x20 + *(long *)(ss._8_8_ + -0x18)) & 0xffffffb5 | 8;
  *(uint *)(&ss.field_0x20 + *(long *)(ss._8_8_ + -0x18)) =
       *(uint *)(&ss.field_0x20 + *(long *)(ss._8_8_ + -0x18)) | 0x4000;
  std::ostream::_M_insert<unsigned_long>((ulong)&ss.field_0x8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base((ios_base *)&ss.field_0x78);
  return __return_storage_ptr__;
}

Assistant:

std::string String::FormatByte(unsigned char value) {
  std::stringstream ss;
  ss << std::setfill('0') << std::setw(2) << std::hex << std::uppercase
     << static_cast<unsigned int>(value);
  return ss.str();
}